

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandSuperChoiceLut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nCutSizeMax;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fVerbose;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  fVerbose = 1;
  nCutSizeMax = 10;
  local_44 = 4;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"KNh"), iVar2 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else if (pAVar3->ntkType == ABC_NTK_STRASH) {
          pAVar3 = Abc_NtkToLogic(pAVar3);
          iVar2 = Abc_NtkSuperChoiceLut(pAVar3,local_44,nCutSizeMax,fVerbose);
          if (iVar2 != 0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
            return 0;
          }
          Abc_NtkDelete(pAVar3);
          pcVar4 = "Superchoicing has failed.\n";
        }
        else {
          pcVar4 = "Superchoicing works only for the AIG representation (run \"strash\").\n";
        }
        iVar2 = -1;
        goto LAB_002152ae;
      }
      if (iVar1 == 0x4e) break;
      if (iVar1 != 0x4b) goto LAB_00215203;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-K\" should be followed by a positive integer.\n";
LAB_002151f4:
        Abc_Print(-1,pcVar4);
        goto LAB_00215203;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if ((int)local_44 < 0) goto LAB_00215203;
    }
    if (argc <= globalUtilOptind) {
      pcVar4 = "Command line switch \"-N\" should be followed by a positive integer.\n";
      goto LAB_002151f4;
    }
    nCutSizeMax = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < (int)nCutSizeMax);
LAB_00215203:
  Abc_Print(-2,"usage: supercl [-K num] [-N num] [-vh]\n");
  Abc_Print(-2,"\t        performs superchoicing for K-LUTs\n");
  Abc_Print(-2,"\t        (accumulate: \"r file.blif; b; scl; f -ac; wb file_sc.blif\")\n");
  Abc_Print(-2,"\t        (FPGA map: \"r file_sc.blif; ft; read_lut lutlibK; fpga\")\n");
  Abc_Print(-2,"\t-K num : the number of LUT inputs [default = %d]\n",(ulong)local_44);
  Abc_Print(-2,"\t-N num : the max size of the cut [default = %d]\n",(ulong)nCutSizeMax);
  pcVar4 = "yes";
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggles verbose output [default = %s]\n",pcVar4);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar2 = -2;
LAB_002152ae:
  Abc_Print(iVar2,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandSuperChoiceLut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int nLutSize;
    int nCutSizeMax;
    int fVerbose;
    extern int Abc_NtkSuperChoiceLut( Abc_Ntk_t * pNtk, int nLutSize, int nCutSizeMax, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fVerbose = 1;
    nLutSize = 4;
    nCutSizeMax = 10;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KNh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nCutSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutSizeMax < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Superchoicing works only for the AIG representation (run \"strash\").\n" );
        return 1;
    }

    // convert the network into the SOP network
    pNtkRes = Abc_NtkToLogic( pNtk );

    // get the new network
    if ( !Abc_NtkSuperChoiceLut( pNtkRes, nLutSize, nCutSizeMax, fVerbose ) )
    {
        Abc_NtkDelete( pNtkRes );
        Abc_Print( -1, "Superchoicing has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: supercl [-K num] [-N num] [-vh]\n" );
    Abc_Print( -2, "\t        performs superchoicing for K-LUTs\n" );
    Abc_Print( -2, "\t        (accumulate: \"r file.blif; b; scl; f -ac; wb file_sc.blif\")\n" );
    Abc_Print( -2, "\t        (FPGA map: \"r file_sc.blif; ft; read_lut lutlibK; fpga\")\n" );
    Abc_Print( -2, "\t-K num : the number of LUT inputs [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-N num : the max size of the cut [default = %d]\n", nCutSizeMax );
    Abc_Print( -2, "\t-v     : toggles verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}